

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_re_repeat(int n,mpc_val_t **xs)

{
  int iVar1;
  mpc_fold_t in_RSI;
  int in_EDI;
  int num;
  mpc_parser_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  mpc_parser_t *local_8;
  
  if (*(long *)(in_RSI + 8) == 0) {
    local_8 = *(mpc_parser_t **)in_RSI;
  }
  else {
    iVar1 = (int)**(char **)(in_RSI + 8);
    if (iVar1 == 0x2a) {
      free(*(void **)(in_RSI + 8));
      local_8 = mpc_many((mpc_fold_t)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
                         in_stack_ffffffffffffffd8);
    }
    else if (iVar1 == 0x2b) {
      free(*(void **)(in_RSI + 8));
      local_8 = mpc_many1((mpc_fold_t)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
                          in_stack_ffffffffffffffd8);
    }
    else if (iVar1 == 0x3f) {
      free(*(void **)(in_RSI + 8));
      local_8 = mpc_maybe_lift((mpc_parser_t *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
                               (mpc_ctor_t)in_stack_ffffffffffffffd8);
    }
    else {
      uVar2 = **(undefined4 **)(in_RSI + 8);
      free(*(void **)(in_RSI + 8));
      local_8 = mpc_count(in_EDI,in_RSI,(mpc_parser_t *)CONCAT44(uVar2,iVar1),
                          (mpc_dtor_t)in_stack_ffffffffffffffd8);
    }
  }
  return local_8;
}

Assistant:

static mpc_val_t *mpcf_re_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpc_many(mpcf_strfold, xs[0]); }; break;
    case '+': { free(xs[1]); return mpc_many1(mpcf_strfold, xs[0]); }; break;
    case '?': { free(xs[1]); return mpc_maybe_lift(xs[0], mpcf_ctor_str); }; break;
    default:
      num = *(int*)xs[1];
      free(xs[1]);
  }

  return mpc_count(num, mpcf_strfold, xs[0], free);
}